

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O3

ostream * ClipperLib::operator<<(ostream *s,IntPoint *p)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>(s,"(",1);
  poVar1 = std::ostream::_M_insert<long_long>((longlong)s);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,",",1);
  poVar1 = std::ostream::_M_insert<long_long>((longlong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,")",1);
  return s;
}

Assistant:

std::ostream& operator <<(std::ostream &s, const IntPoint &p)
{
  s << "(" << p.X << "," << p.Y << ")";
  return s;
}